

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O0

BOOL GetThreadContext(HANDLE hThread,LPCONTEXT lpContext)

{
  BOOL BVar1;
  DWORD dwProcessId;
  pthread_t self;
  BOOL local_3c;
  IPalObject *pIStack_38;
  BOOL ret;
  IPalObject *pobjThread;
  CPalThread *pTargetThread;
  CPalThread *pThread;
  LPCONTEXT p_Stack_18;
  PAL_ERROR palError;
  LPCONTEXT lpContext_local;
  HANDLE hThread_local;
  
  pIStack_38 = (IPalObject *)0x0;
  local_3c = 0;
  p_Stack_18 = lpContext;
  lpContext_local = (LPCONTEXT)hThread;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  pTargetThread = CorUnix::InternalGetCurrentThread();
  pThread._4_4_ =
       CorUnix::InternalGetThreadDataFromHandle
                 (pTargetThread,lpContext_local,0,(CPalThread **)&pobjThread,
                  &stack0xffffffffffffffc8);
  if (pThread._4_4_ == 0) {
    BVar1 = CorUnix::CPalThread::IsDummy((CPalThread *)pobjThread);
    if (BVar1 == 0) {
      dwProcessId = GetCurrentProcessId();
      self = CorUnix::CPalThread::GetPThreadSelf((CPalThread *)pobjThread);
      local_3c = CONTEXT_GetThreadContext(dwProcessId,self,p_Stack_18);
    }
    else {
      fprintf(_stderr,"] %s %s:%d","GetThreadContext",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/debug/debug.cpp"
              ,0x1dd);
      fprintf(_stderr,"Dummy thread handle passed to GetThreadContext\n");
      CorUnix::CPalThread::SetLastError(6);
    }
  }
  else {
    CorUnix::CPalThread::SetLastError(pThread._4_4_);
  }
  if (pIStack_38 != (IPalObject *)0x0) {
    (*pIStack_38->_vptr_IPalObject[8])(pIStack_38,pTargetThread);
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    return local_3c;
  }
  abort();
}

Assistant:

BOOL
PALAPI
GetThreadContext(
           IN HANDLE hThread,
           IN OUT LPCONTEXT lpContext)
{
    PAL_ERROR palError;
    CPalThread *pThread;
    CPalThread *pTargetThread;
    IPalObject *pobjThread = NULL;
    BOOL ret = FALSE;

    PERF_ENTRY(GetThreadContext);
    ENTRY("GetThreadContext (hThread=%p, lpContext=%p)\n",hThread,lpContext);

    pThread = InternalGetCurrentThread();

    palError = InternalGetThreadDataFromHandle(
        pThread,
        hThread,
        0, // THREAD_GET_CONTEXT
        &pTargetThread,
        &pobjThread
        );

    if (NO_ERROR == palError)
    {
        if (!pTargetThread->IsDummy())
        {
            ret = CONTEXT_GetThreadContext(
                GetCurrentProcessId(),
                pTargetThread->GetPThreadSelf(),
                lpContext
                );
        }
        else
        {
            ASSERT("Dummy thread handle passed to GetThreadContext\n");
            pThread->SetLastError(ERROR_INVALID_HANDLE);
        }
    }
    else
    {
        pThread->SetLastError(palError);
    }

    if (NULL != pobjThread)
    {
        pobjThread->ReleaseReference(pThread);
    }

    LOGEXIT("GetThreadContext returns ret:%d\n", ret);
    PERF_EXIT(GetThreadContext);
    return ret;
}